

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.cc
# Opt level: O2

ASN1_OBJECT *
create_object_with_text_oid(_func_int *get_nid,char *oid,char *short_name,char *long_name)

{
  int iVar1;
  size_t len_00;
  ASN1_OBJECT *pAVar2;
  uint8_t *buf;
  size_t len;
  CBB cbb;
  
  iVar1 = CBB_init(&cbb,0x20);
  if (iVar1 != 0) {
    len_00 = strlen(oid);
    iVar1 = CBB_add_asn1_oid_from_text(&cbb,oid,len_00);
    if ((iVar1 != 0) && (iVar1 = CBB_finish(&cbb,&buf,&len), iVar1 != 0)) {
      if (get_nid == (_func_int *)0x0) {
        iVar1 = 0;
      }
      else {
        iVar1 = (*get_nid)();
      }
      pAVar2 = ASN1_OBJECT_create(iVar1,buf,(int)len,short_name,long_name);
      OPENSSL_free(buf);
      return (ASN1_OBJECT *)pAVar2;
    }
  }
  ERR_put_error(8,0,0x65,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/obj/obj.cc"
                ,0x163);
  CBB_cleanup(&cbb);
  return (ASN1_OBJECT *)0x0;
}

Assistant:

static ASN1_OBJECT *create_object_with_text_oid(int (*get_nid)(void),
                                                const char *oid,
                                                const char *short_name,
                                                const char *long_name) {
  uint8_t *buf;
  size_t len;
  CBB cbb;
  if (!CBB_init(&cbb, 32) ||
      !CBB_add_asn1_oid_from_text(&cbb, oid, strlen(oid)) ||
      !CBB_finish(&cbb, &buf, &len)) {
    OPENSSL_PUT_ERROR(OBJ, OBJ_R_INVALID_OID_STRING);
    CBB_cleanup(&cbb);
    return NULL;
  }

  ASN1_OBJECT *ret = ASN1_OBJECT_create(get_nid ? get_nid() : NID_undef, buf,
                                        len, short_name, long_name);
  OPENSSL_free(buf);
  return ret;
}